

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HeapBlockMap.cpp
# Opt level: O0

uint __thiscall
Memory::HeapBlockMap32::GetMarkCount(HeapBlockMap32 *this,void *address,uint pageCount)

{
  uint local_20;
  uint local_1c;
  uint markCount;
  uint pageCount_local;
  void *address_local;
  HeapBlockMap32 *this_local;
  
  local_20 = 0;
  local_1c = pageCount;
  _markCount = address;
  address_local = this;
  ForEachChunkInAddressRange<Memory::HeapBlockMap32::GetMarkCount(void*,unsigned_int)::__0>
            (this,address,(ulong)pageCount,(anon_class_8_1_dc0f18e2)&local_20);
  return local_20;
}

Assistant:

uint
HeapBlockMap32::GetMarkCount(void * address, uint pageCount)
{
    uint markCount = 0;

    ForEachChunkInAddressRange(address, pageCount, [&](L2MapChunk* l2Map, uint chunkId)
    {
        markCount += l2Map->GetPageMarkBitVector(chunkId /* pageIndex */)->Count();
    });

    return markCount;
}